

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  byte bVar1;
  stbtt__buf fontdict;
  bool bVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  stbtt_uint32 sVar6;
  long lVar7;
  int *piVar8;
  undefined1 uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uchar *puVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float dx3;
  float fVar30;
  uint uVar31;
  float fVar32;
  float fVar33;
  stbtt__buf b;
  stbtt__buf sVar34;
  float in_stack_fffffffffffffdd0;
  int iVar35;
  undefined4 uVar36;
  uint uStack_220;
  int iStack_21c;
  ulong local_210;
  uchar *puVar37;
  undefined1 local_1f8 [16];
  long local_1e8;
  float fStack_1e0;
  int local_1dc;
  float s [48];
  stbtt__buf local_f0;
  int *local_e0;
  stbtt__buf subr_stack [10];
  
  puVar37 = (info->subrs).data;
  local_f0.cursor = (info->subrs).cursor;
  local_f0.size = (info->subrs).size;
  sVar34 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar26 = sVar34._8_8_;
  uVar36 = sVar34.data._0_4_;
  iVar22 = sVar34.data._4_4_;
  iStack_21c = sVar34.size;
  if (iStack_21c <= sVar34.cursor) {
switchD_0018e7fb_default:
    return 0;
  }
  local_f0.data = puVar37;
  lVar14 = (long)glyph_index + 1;
  local_e0 = &(info->gsubrs).cursor;
  iVar35 = 1;
  puVar37 = (uchar *)0x0;
  local_210 = 0;
  bVar2 = false;
  uVar24 = 0;
  local_1dc = glyph_index;
LAB_0018e559:
  fVar30 = s[0xb];
  dx3 = s[10];
  fVar5 = s[8];
  fVar27 = s[7];
  fVar4 = s[6];
  fVar33 = s[5];
  fVar28 = s[4];
  fVar29 = s[3];
  fVar32 = s[1];
  uVar11 = (uint)uVar26;
  uStack_220 = uVar11 + 1;
  bVar1 = *(byte *)(CONCAT44(iVar22,uVar36) + (long)(int)uVar11);
  uVar31 = (uint)uVar24;
  iVar15 = (int)local_210;
  switch(bVar1) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    puVar37 = (uchar *)(ulong)(uint)((int)puVar37 + ((int)((int)(uVar24 >> 0x1f) + uVar31) >> 1));
    goto LAB_0018f1af;
  default:
    if (bVar1 < 0x20 && bVar1 != 0x1c) {
      return 0;
    }
    if (bVar1 == 0xff) {
      uVar11 = 0;
      iVar15 = 4;
      do {
        if ((int)uStack_220 < iStack_21c) {
          lVar20 = (long)(int)uStack_220;
          uStack_220 = uStack_220 + 1;
          uVar16 = (uint)*(byte *)(CONCAT44(iVar22,uVar36) + lVar20);
        }
        else {
          uVar16 = 0;
        }
        uVar11 = uVar11 << 8 | uVar16;
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
      fVar28 = (float)(int)uVar11 * 1.5258789e-05;
    }
    else {
      if (((int)uStack_220 < 1) || (iStack_21c < (int)uVar11)) goto LAB_0018f1ea;
      sVar6 = stbtt__cff_int((stbtt__buf *)&stack0xfffffffffffffdd8);
      fVar28 = (float)(int)(short)sVar6;
      uStack_220 = uVar11;
    }
    if (0x2f < (int)uVar31) {
      return 0;
    }
    s[(int)uVar31] = fVar28;
    uVar25 = (ulong)(uVar31 + 1);
    break;
  case 4:
    if ((int)uVar31 < 1) {
      return 0;
    }
    fVar27 = s[uVar31 - 1];
    fVar28 = 0.0;
    goto LAB_0018ea1e;
  case 5:
    if ((int)uVar31 < 2) {
      return 0;
    }
    uVar26 = 1;
    do {
      fVar28 = s[uVar26];
      fVar27 = s[uVar26 - 1] + c->x;
      c->x = fVar27;
      fVar28 = fVar28 + c->y;
      c->y = fVar28;
      uVar25 = 0;
      stbtt__csctx_v(c,'\x02',(int)fVar27,(int)fVar28,0,0,0,0);
      uVar26 = uVar26 + 2;
    } while (uVar26 < uVar24);
    break;
  case 6:
    iVar15 = 0;
    if ((int)uVar31 < 1) {
      return 0;
    }
    for (; iVar15 < (int)uVar31; iVar15 = iVar15 + 1) {
      fVar28 = s[iVar15] + c->x;
      c->x = fVar28;
      fVar27 = c->y + 0.0;
      c->y = fVar27;
      stbtt__csctx_v(c,'\x02',(int)fVar28,(int)fVar27,0,0,0,0);
      iVar15 = iVar15 + 1;
LAB_0018f15a:
      if ((int)uVar31 <= iVar15) break;
      fVar28 = s[iVar15];
      fVar27 = c->x + 0.0;
      c->x = fVar27;
      fVar28 = fVar28 + c->y;
      c->y = fVar28;
      stbtt__csctx_v(c,'\x02',(int)fVar27,(int)fVar28,0,0,0,0);
    }
    goto LAB_0018f1af;
  case 7:
    iVar15 = 0;
    if (0 < (int)uVar31) goto LAB_0018f15a;
    return 0;
  case 8:
    if ((int)uVar31 < 6) {
      return 0;
    }
    uVar26 = 5;
    do {
      stbtt__csctx_rccurve_to
                (c,*(float *)(local_1f8 + uVar26 * 4 + 0xc),(&fStack_1e0)[uVar26 - 2],
                 (&fStack_1e0)[uVar26 - 1],(&fStack_1e0)[uVar26],s[uVar26 - 1],s[uVar26]);
      uVar26 = uVar26 + 6;
    } while (uVar26 < uVar24);
    goto LAB_0018f1af;
  case 10:
    bVar3 = true;
    if (!bVar2) {
      uVar11 = (info->fdselect).size;
      if (uVar11 != 0) {
        if ((int)uVar11 < 0) goto LAB_0018f1ea;
        puVar18 = (info->fdselect).data;
        if (*puVar18 == '\0') {
          if (uVar11 < (uint)lVar14) goto LAB_0018f1ea;
          uVar16 = 0;
          if ((int)(uint)lVar14 < (int)uVar11) {
            uVar16 = (uint)puVar18[lVar14];
          }
        }
        else {
          if (*puVar18 == '\x03') {
            uVar12 = 0;
            iVar17 = 1;
            iVar10 = 2;
            do {
              if (iVar17 < (int)uVar11) {
                lVar20 = (long)iVar17;
                iVar17 = iVar17 + 1;
                uVar16 = (uint)puVar18[lVar20];
              }
              else {
                uVar16 = 0;
              }
              uVar12 = uVar12 << 8 | uVar16;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
            uVar19 = 0;
            iVar10 = 2;
            do {
              if (iVar17 < (int)uVar11) {
                lVar20 = (long)iVar17;
                iVar17 = iVar17 + 1;
                uVar16 = (uint)puVar18[lVar20];
              }
              else {
                uVar16 = 0;
              }
              uVar19 = uVar19 << 8 | uVar16;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
            if (0 < (int)uVar12) {
              uVar21 = 0;
              do {
                if (iVar17 < (int)uVar11) {
                  lVar20 = (long)iVar17;
                  iVar17 = iVar17 + 1;
                  uVar16 = (uint)puVar18[lVar20];
                }
                else {
                  uVar16 = 0;
                }
                uVar23 = 0;
                iVar10 = 2;
                do {
                  if (iVar17 < (int)uVar11) {
                    lVar20 = (long)iVar17;
                    iVar17 = iVar17 + 1;
                    uVar13 = (uint)puVar18[lVar20];
                  }
                  else {
                    uVar13 = 0;
                  }
                  uVar23 = uVar23 << 8 | uVar13;
                  iVar10 = iVar10 + -1;
                } while (iVar10 != 0);
                local_1e8 = lVar14;
                if (local_1dc < (int)uVar23 && (int)uVar19 <= local_1dc) goto LAB_0018eef2;
                uVar21 = uVar21 + 1;
                uVar19 = uVar23;
              } while (uVar21 != uVar12);
            }
          }
          uVar16 = 0xffffffff;
        }
LAB_0018eef2:
        stbtt__cff_index_get(info->fontdicts,uVar16);
        sVar34.data._4_4_ = iVar35;
        sVar34.data._0_4_ = in_stack_fffffffffffffdd0;
        sVar34.cursor = uVar36;
        sVar34.size = iVar22;
        fontdict._8_8_ = info;
        fontdict.data = puVar37;
        local_f0 = stbtt__get_subrs(sVar34,fontdict);
        bVar3 = true;
      }
    }
    goto LAB_0018ef40;
  case 0xb:
    if (iVar15 < 1) {
      return 0;
    }
    local_210 = (ulong)(iVar15 - 1);
    uVar36 = *(undefined4 *)&subr_stack[local_210].data;
    iVar22 = *(int *)((long)&subr_stack[local_210].data + 4);
    uStack_220 = subr_stack[local_210].cursor;
    iStack_21c = subr_stack[local_210].size;
    uVar25 = uVar24;
    break;
  case 0xc:
    lVar20 = (long)(int)uStack_220;
    uVar9 = 0;
    if ((int)uStack_220 < iStack_21c) {
      uStack_220 = uVar11 + 2;
      uVar9 = *(undefined1 *)(CONCAT44(iVar22,uVar36) + lVar20);
    }
    switch(uVar9) {
    case 0x22:
      if ((int)uVar31 < 7) {
        return 0;
      }
      local_1f8 = ZEXT416((uint)s[2]);
      dx3 = s[6];
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      fVar32 = -(float)local_1f8._0_4_;
      fVar27 = 0.0;
      fVar30 = 0.0;
      in_stack_fffffffffffffdd0 = dx3;
      break;
    case 0x23:
      if ((int)uVar31 < 0xd) {
        return 0;
      }
      local_1f8._0_4_ = s[9];
      fVar28 = s[6];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar33 = fVar5;
      fVar32 = (float)local_1f8._0_4_;
      in_stack_fffffffffffffdd0 = fVar28;
      break;
    case 0x24:
      if ((int)uVar31 < 9) {
        return 0;
      }
      local_1f8._0_4_ = s[7];
      fVar28 = s[5];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      fVar30 = -(fVar32 + fVar29 + (float)local_1f8._0_4_);
      fVar27 = 0.0;
      fVar33 = fVar4;
      fVar32 = (float)local_1f8._0_4_;
      dx3 = fVar5;
      in_stack_fffffffffffffdd0 = fVar28;
      break;
    case 0x25:
      if ((int)uVar31 < 0xb) {
        return 0;
      }
      fVar29 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar32 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar28 = ABS(fVar29);
      fVar33 = ABS(fVar32);
      local_1f8._0_4_ = s[9];
      fVar30 = s[10];
      if (fVar33 < fVar28) {
        fVar30 = -fVar32;
      }
      uVar11 = -(uint)(fVar33 < fVar28);
      uVar31 = (uint)s[10] & uVar11;
      fVar28 = s[6];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar33 = fVar5;
      fVar32 = (float)local_1f8._0_4_;
      dx3 = (float)(~uVar11 & (uint)-fVar29 | uVar31);
      in_stack_fffffffffffffdd0 = fVar28;
      break;
    default:
      goto switchD_0018e7fb_default;
    }
    goto LAB_0018e942;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (iVar35 != 0) {
      puVar37 = (uchar *)(ulong)(uint)((int)puVar37 + ((int)((int)(uVar24 >> 0x1f) + uVar31) >> 1));
    }
    iVar15 = (int)puVar37 + 7;
    iVar35 = (int)puVar37 + 0xe;
    if (-1 < iVar15) {
      iVar35 = iVar15;
    }
    uStack_220 = (iVar35 >> 3) + uStack_220;
    if (((int)uStack_220 < 0) || (iStack_21c < (int)uStack_220)) goto LAB_0018f1ea;
    goto LAB_0018ebbf;
  case 0x15:
    if ((int)uVar31 < 2) {
      return 0;
    }
    fVar28 = s[uVar31 - 2];
    fVar27 = s[uVar31 - 1];
    goto LAB_0018ea1e;
  case 0x16:
    if ((int)uVar31 < 1) {
      return 0;
    }
    fVar28 = s[uVar31 - 1];
    fVar27 = 0.0;
LAB_0018ea1e:
    stbtt__csctx_rmove_to(c,fVar28,fVar27);
LAB_0018ebbf:
    iVar35 = 0;
    uVar25 = 0;
    break;
  case 0x18:
    if ((int)uVar31 < 8) {
      return 0;
    }
    lVar20 = -6;
    do {
      lVar7 = lVar20;
      stbtt__csctx_rccurve_to
                (c,s[lVar7 + 6],s[lVar7 + 7],s[lVar7 + 8],s[lVar7 + 9],s[lVar7 + 10],s[lVar7 + 0xb])
      ;
      lVar20 = lVar7 + 6;
    } while (lVar7 + 6 < (long)(int)uVar31 + -0xd);
    if ((int)uVar31 <= (int)lVar7 + 0xd) {
      return 0;
    }
    fVar28 = s[lVar7 + 0xd];
    fVar27 = s[lVar7 + 0xc] + c->x;
    c->x = fVar27;
    fVar28 = fVar28 + c->y;
    c->y = fVar28;
    stbtt__csctx_v(c,'\x02',(int)fVar27,(int)fVar28,0,0,0,0);
    uVar25 = 0;
    break;
  case 0x19:
    if ((int)uVar31 < 8) {
      return 0;
    }
    lVar20 = 5;
    local_1e8 = lVar14;
    do {
      lVar7 = lVar20;
      fVar28 = (&fStack_1e0)[lVar7 + -2];
      fVar27 = *(float *)(local_1f8 + lVar7 * 4 + 0xc) + c->x;
      c->x = fVar27;
      fVar28 = fVar28 + c->y;
      c->y = fVar28;
      stbtt__csctx_v(c,'\x02',(int)fVar27,(int)fVar28,0,0,0,0);
      lVar20 = lVar7 + 2;
    } while (lVar7 + -2 < (long)(int)(uVar31 - 6));
    if ((int)uVar31 <= (int)lVar20) {
      return 0;
    }
    fVar28 = *(float *)(local_1f8 + lVar20 * 4 + 0xc);
    fVar27 = (&fStack_1e0)[lVar7];
    fVar30 = s[lVar20];
    lVar14 = local_1e8;
    fVar33 = (&fStack_1e0)[lVar7 + 1];
    fVar32 = (&fStack_1e0)[lVar20];
    dx3 = s[lVar7 + 1];
LAB_0018e942:
    stbtt__csctx_rccurve_to(c,fVar28,fVar27,fVar33,fVar32,dx3,fVar30);
    goto LAB_0018f1af;
  case 0x1a:
  case 0x1b:
    if ((int)uVar31 < 4) {
      return 0;
    }
    uVar26 = (ulong)(uVar31 & 1);
    if ((int)((uVar31 & 1) + 3) < (int)uVar31) {
      fVar28 = 0.0;
      if ((uVar24 & 1) != 0) {
        fVar28 = s[0];
      }
      do {
        iVar15 = (int)uVar26;
        fVar27 = s[uVar26];
        fVar30 = s[iVar15 + 3];
        if (bVar1 == 0x1b) {
          fVar32 = fVar27;
          fVar27 = fVar28;
          fVar29 = fVar30;
          fVar30 = 0.0;
        }
        else {
          fVar29 = 0.0;
          fVar32 = fVar28;
        }
        stbtt__csctx_rccurve_to(c,fVar32,fVar27,s[uVar26 + 1],s[uVar26 + 2],fVar29,fVar30);
        uVar26 = uVar26 + 4;
        fVar28 = 0.0;
      } while (iVar15 + 7 < (int)uVar31);
    }
    goto LAB_0018f1af;
  case 0x1d:
    bVar3 = bVar2;
LAB_0018ef40:
    if ((int)uVar31 < 1) {
      return 0;
    }
    if (9 < iVar15) {
      return 0;
    }
    fVar28 = s[uVar31 - 1];
    *(undefined4 *)&subr_stack[iVar15].data = uVar36;
    *(int *)((long)&subr_stack[iVar15].data + 4) = iVar22;
    subr_stack[iVar15].cursor = uStack_220;
    subr_stack[iVar15].size = iStack_21c;
    piVar8 = &local_f0.cursor;
    puVar18 = local_f0.data;
    if (bVar1 != 10) {
      puVar18 = (info->gsubrs).data;
      piVar8 = local_e0;
    }
    uVar26 = *(ulong *)piVar8;
    if ((long)uVar26 < 0) {
LAB_0018f1ea:
      __assert_fail("!(o > b->size || o < 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_truetype.h"
                    ,0x482,"void stbtt__buf_seek(stbtt__buf *, int)");
    }
    local_210 = (ulong)(iVar15 + 1);
    uVar16 = 0;
    iVar22 = 2;
    uVar11 = 0;
    do {
      if ((int)uVar16 < (int)(uVar26 >> 0x20)) {
        lVar20 = (long)(int)uVar16;
        uVar16 = uVar16 + 1;
        uVar12 = (uint)puVar18[lVar20];
      }
      else {
        uVar12 = 0;
      }
      uVar11 = uVar11 << 8 | uVar12;
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
    uVar12 = (uint)(0x4d7 < (int)uVar11) << 10 | 0x6b;
    if (0x846b < (int)uVar11) {
      uVar12 = 0x8000;
    }
    iVar22 = uVar12 + (int)fVar28;
    sVar34 = (stbtt__buf)ZEXT816(0);
    if (iVar22 < (int)uVar11 && -1 < iVar22) {
      b._8_8_ = (ulong)uVar16 | uVar26 & 0x7fffffff00000000;
      b.data = puVar18;
      sVar34 = stbtt__cff_index_get(b,iVar22);
    }
    uVar36 = sVar34.data._0_4_;
    iVar22 = sVar34.data._4_4_;
    iStack_21c = sVar34.size;
    if (iStack_21c == 0) {
      return 0;
    }
    uStack_220 = 0;
    uVar25 = (ulong)(uVar31 - 1);
    bVar2 = bVar3;
    break;
  case 0x1e:
    iVar15 = 0;
    if ((int)uVar31 < 4) {
      return 0;
    }
    for (; iVar15 + 3 < (int)uVar31; iVar15 = iVar15 + 4) {
      fVar28 = 0.0;
      if (uVar31 - iVar15 == 5) {
        fVar28 = s[(long)iVar15 + 4];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar15],s[(long)iVar15 + 1],s[(long)iVar15 + 2],s[iVar15 + 3],fVar28);
      iVar15 = iVar15 + 4;
LAB_0018f0b4:
      if ((int)uVar31 <= iVar15 + 3) break;
      fVar28 = 0.0;
      if (uVar31 - iVar15 == 5) {
        fVar28 = s[(long)iVar15 + 4];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar15],0.0,s[(long)iVar15 + 1],s[(long)iVar15 + 2],fVar28,s[iVar15 + 3]);
    }
LAB_0018f1af:
    uVar25 = 0;
    break;
  case 0x1f:
    iVar15 = 0;
    if (3 < (int)uVar31) goto LAB_0018f0b4;
    return 0;
  }
  uVar26 = (ulong)uStack_220;
  uVar24 = uVar25;
  if (iStack_21c <= (int)uStack_220) {
    return 0;
  }
  goto LAB_0018e559;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // FALLTHROUGH
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && b0 < 32)
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}